

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O2

void __thiscall curlpp::internal::OptionList::setOpt(OptionList *this,OptionBase *option)

{
  mapType *this_00;
  iterator __position;
  pair<CURLoption,_curlpp::OptionBase_*> local_30;
  
  this_00 = &this->mOptions;
  local_30.first = OptionBase::getOption(option);
  __position = std::
               _Rb_tree<CURLoption,_std::pair<const_CURLoption,_curlpp::OptionBase_*>,_std::_Select1st<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
               ::find(&this_00->_M_t,&local_30.first);
  if ((_Rb_tree_header *)__position._M_node != &(this->mOptions)._M_t._M_impl.super__Rb_tree_header)
  {
    if (__position._M_node[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)__position._M_node[1]._M_parent + 8))();
    }
    std::
    _Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
    ::erase_abi_cxx11_((_Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
                        *)this_00,__position);
  }
  local_30.first = OptionBase::getOption(option);
  local_30.second = option;
  std::
  _Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
  ::_M_emplace_unique<std::pair<CURLoption,curlpp::OptionBase*>>
            ((_Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
              *)this_00,&local_30);
  return;
}

Assistant:

void OptionList::setOpt(curlpp::OptionBase * option)
{
   mapType::iterator pos = mOptions.find(option->getOption());
   if(pos != mOptions.end())
   {
      delete (*pos).second;
      mOptions.erase(pos);	
   }
   mOptions.insert(std::make_pair(option->getOption(), option));
}